

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O0

void TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse_Parse<(TTD::NSLogEvents::EventKind)46,2ul>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  JsRTVarsArgumentAction_InternalUse<2UL> *pJVar1;
  TTDVar pvVar2;
  FileReader *reader_00;
  FileReader *reader_01;
  FileReader *extraout_RDX;
  ulong local_38;
  size_t i;
  JsRTVarsArgumentAction_InternalUse<2UL> *vAction;
  UnlinkableSlabAllocator *alloc_local;
  FileReader *reader_local;
  ThreadContext *threadContext_local;
  EventLogEntry *evt_local;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<2ul>,(TTD::NSLogEvents::EventKind)46>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar2 = NSSnapValues::ParseTTDVar((NSSnapValues *)0x0,SUB81(reader,0),reader_01);
  pJVar1->Result = pvVar2;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  reader_00 = extraout_RDX;
  for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
    reader_00 = (FileReader *)
                NSSnapValues::ParseTTDVar
                          ((NSSnapValues *)(ulong)(local_38 != 0),SUB81(reader,0),reader_00);
    pJVar1->VarArray[local_38] = reader_00;
  }
  (*reader->_vptr_FileReader[5])();
  return;
}

Assistant:

void JsRTVarsArgumentAction_InternalUse_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTVarsArgumentAction_InternalUse<count>* vAction = GetInlineEventDataAs<JsRTVarsArgumentAction_InternalUse<count>, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            vAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            if(count == 1)
            {
                vAction->VarArray[0] = NSSnapValues::ParseTTDVar(true, reader);
            }
            else
            {
                reader->ReadSequenceStart_WDefaultKey(true);
                for(size_t i = 0; i < count; ++i)
                {
                    vAction->VarArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
                }
                reader->ReadSequenceEnd();
            }
        }